

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

CompressionRecord Imf_3_4::anon_unknown_1::retrieveCompressionRecord(Header *hdr)

{
  int iVar1;
  CompressionRecord in_RAX;
  pthread_mutex_t *__mutex;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  CompressionRecord retval;
  CompressionRecord local_18;
  
  local_18 = in_RAX;
  exr_get_default_zip_compression_level(&local_18);
  exr_get_default_dwa_compression_quality(&local_18.dwa_level);
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    lVar2 = (long)__mutex + 0x30;
    lVar3 = lVar2;
    for (lVar4 = *(long *)((long)__mutex + 0x38); lVar4 != 0;
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar5 * 8)) {
      bVar5 = *(Header **)(lVar4 + 0x20) < hdr;
      if (!bVar5) {
        lVar3 = lVar4;
      }
    }
    lVar4 = lVar2;
    if ((lVar3 != lVar2) && (lVar4 = lVar3, hdr < *(Header **)(lVar3 + 0x20))) {
      lVar4 = lVar2;
    }
    if (lVar4 != lVar2) {
      local_18 = *(CompressionRecord *)(lVar4 + 0x28);
    }
    pthread_mutex_unlock(__mutex);
  }
  return local_18;
}

Assistant:

static CompressionRecord
retrieveCompressionRecord (const Header* hdr)
{
    CompressionRecord retval;

    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) retval = i->second;
    }
    return retval;
}